

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intel_acbp_v1.cpp
# Opt level: O2

void __thiscall
intel_acbp_v1_t::acbp_element_t::acbp_element_t
          (acbp_element_t *this,kstream *p__io,intel_acbp_v1_t *p__parent,intel_acbp_v1_t *p__root)

{
  (this->super_kstruct).m__io = p__io;
  (this->super_kstruct)._vptr_kstruct = (_func_int **)&PTR__acbp_element_t_00181330;
  (this->m_invalid_body)._M_dataplus._M_p = (pointer)&(this->m_invalid_body).field_2;
  (this->m_invalid_body)._M_string_length = 0;
  (this->m_invalid_body).field_2._M_local_buf[0] = '\0';
  this->m__parent = p__parent;
  this->m__root = p__root;
  (this->m_pmda_body)._M_t.
  super___uniq_ptr_impl<intel_acbp_v1_t::pmda_body_t,_std::default_delete<intel_acbp_v1_t::pmda_body_t>_>
  ._M_t.
  super__Tuple_impl<0UL,_intel_acbp_v1_t::pmda_body_t_*,_std::default_delete<intel_acbp_v1_t::pmda_body_t>_>
  .super__Head_base<0UL,_intel_acbp_v1_t::pmda_body_t_*,_false>._M_head_impl = (pmda_body_t *)0x0;
  (this->m_pmsg_body)._M_t.
  super___uniq_ptr_impl<intel_acbp_v1_t::pmsg_body_t,_std::default_delete<intel_acbp_v1_t::pmsg_body_t>_>
  ._M_t.
  super__Tuple_impl<0UL,_intel_acbp_v1_t::pmsg_body_t_*,_std::default_delete<intel_acbp_v1_t::pmsg_body_t>_>
  .super__Head_base<0UL,_intel_acbp_v1_t::pmsg_body_t_*,_false>._M_head_impl = (pmsg_body_t *)0x0;
  (this->m_header)._M_t.
  super___uniq_ptr_impl<intel_acbp_v1_t::common_header_t,_std::default_delete<intel_acbp_v1_t::common_header_t>_>
  ._M_t.
  super__Tuple_impl<0UL,_intel_acbp_v1_t::common_header_t_*,_std::default_delete<intel_acbp_v1_t::common_header_t>_>
  .super__Head_base<0UL,_intel_acbp_v1_t::common_header_t_*,_false>._M_head_impl =
       (common_header_t *)0x0;
  (this->m_ibbs_body)._M_t.
  super___uniq_ptr_impl<intel_acbp_v1_t::ibbs_body_t,_std::default_delete<intel_acbp_v1_t::ibbs_body_t>_>
  ._M_t.
  super__Tuple_impl<0UL,_intel_acbp_v1_t::ibbs_body_t_*,_std::default_delete<intel_acbp_v1_t::ibbs_body_t>_>
  .super__Head_base<0UL,_intel_acbp_v1_t::ibbs_body_t_*,_false>._M_head_impl = (ibbs_body_t *)0x0;
  _read(this);
  return;
}

Assistant:

intel_acbp_v1_t::acbp_element_t::acbp_element_t(kaitai::kstream* p__io, intel_acbp_v1_t* p__parent, intel_acbp_v1_t* p__root) : kaitai::kstruct(p__io) {
    m__parent = p__parent;
    m__root = p__root;
    m_header = nullptr;
    m_ibbs_body = nullptr;
    m_pmda_body = nullptr;
    m_pmsg_body = nullptr;
    _read();
}